

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O1

void __thiscall embree::FilteredStatistics::add(FilteredStatistics *this,float a)

{
  pointer *ppfVar1;
  float fVar2;
  iterator __position;
  pointer pfVar3;
  pointer pfVar4;
  ulong uVar5;
  size_t sVar6;
  size_t i;
  long lVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  float fVar14;
  float local_3c;
  undefined1 local_38 [16];
  
  __position._M_current =
       (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3c = a;
  if (__position._M_current ==
      (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)&this->v,__position,&local_3c);
  }
  else {
    *__position._M_current = a;
    ppfVar1 = &(this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppfVar1 = *ppfVar1 + 1;
  }
  pfVar3 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar3 != pfVar4) {
    uVar5 = (long)pfVar4 - (long)pfVar3 >> 2;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<float>>>
              (pfVar3,pfVar4,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<float>>>
              (pfVar3,pfVar4);
  }
  pfVar3 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar3;
  lVar8 = lVar7 >> 2;
  auVar12._8_4_ = (int)(lVar7 >> 0x22);
  auVar12._0_8_ = lVar8;
  auVar12._12_4_ = 0x45300000;
  dVar13 = auVar12._8_8_ - 1.9342813113834067e+25;
  dVar11 = dVar13 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  local_38._8_4_ = SUB84(dVar13,0);
  local_38._0_8_ = dVar11;
  local_38._12_4_ = (int)((ulong)dVar13 >> 0x20);
  dVar11 = floor((double)this->fskip_small * 0.5 * dVar11);
  uVar5 = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
  dVar11 = floor((double)this->fskip_large * 0.5 * (double)local_38._0_8_);
  (this->stat).v = 0.0;
  (this->stat).v2 = 0.0;
  (this->stat).vmin = INFINITY;
  (this->stat).vmax = -INFINITY;
  (this->stat).N = 0;
  uVar9 = lVar8 - ((long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11);
  if (uVar5 < uVar9) {
    sVar6 = (this->stat).N;
    fVar14 = (this->stat).vmax;
    fVar10 = (this->stat).vmin;
    dVar11 = (this->stat).v;
    dVar13 = (this->stat).v2;
    do {
      sVar6 = sVar6 + 1;
      fVar2 = pfVar3[uVar5];
      dVar11 = dVar11 + (double)fVar2;
      dVar13 = dVar13 + (double)(fVar2 * fVar2);
      (this->stat).v = dVar11;
      (this->stat).v2 = dVar13;
      if (fVar2 <= fVar10) {
        fVar10 = fVar2;
      }
      (this->stat).vmin = fVar10;
      if (fVar2 <= fVar14) {
        fVar2 = fVar14;
      }
      fVar14 = fVar2;
      (this->stat).vmax = fVar14;
      (this->stat).N = sVar6;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar9);
  }
  return;
}

Assistant:

void add(float a) 
    {
      v.push_back(a);
      std::sort(v.begin(),v.end(),std::less<float>());
      size_t skip_small = (size_t) floor(0.5*fskip_small*double(v.size()));
      size_t skip_large = (size_t) floor(0.5*fskip_large*double(v.size()));

      stat = Statistics();
      for (size_t i=skip_small; i<v.size()-skip_large; i++)
        stat.add(v[i]);
    }